

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

basic_substring<const_char> __thiscall
c4::basic_substring<const_char>::first_uint_span(basic_substring<const_char> *this)

{
  char cVar1;
  basic_substring<const_char> ne;
  basic_substring<const_char> local_18;
  
  local_18 = first_non_empty_span(this);
  if (local_18.str != (char *)0x0 && local_18.len != 0) {
    cVar1 = *local_18.str;
    if (cVar1 == '-') {
      local_18.len = 0;
      local_18.str = this->str;
    }
    else {
      local_18 = _first_integral_span(&local_18,(ulong)(cVar1 == '+'));
    }
  }
  return local_18;
}

Assistant:

basic_substring first_uint_span() const
    {
        basic_substring ne = first_non_empty_span();
        if(ne.empty())
            return ne;
        if(ne.str[0] == '-')
            return first(0);
        size_t skip_start = (ne.str[0] == '+') ? 1 : 0;
        return ne._first_integral_span(skip_start);
    }